

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O2

int tcv_init(tcv_t *tcv)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  uint8_t identifier;
  
  _Var1 = tcv_check_and_lock_ok(tcv);
  if (_Var1) {
    uVar2 = (*tcv->read)(tcv->index,'P','\0',&identifier,1);
    if ((int)uVar2 < 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
    }
    else {
      if (tcv->data != (void *)0x0) {
        free(tcv->data);
        tcv->data = (void *)0x0;
      }
      if (identifier == '\x03') {
        uVar2 = sfp_init(tcv);
        iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
        uVar2 = -(uint)(iVar3 != 0) | uVar2;
      }
      else {
        uVar2 = 0xffffffff;
      }
    }
  }
  else {
    uVar2 = 0xfffffffc;
  }
  return uVar2;
}

Assistant:

int tcv_init(tcv_t *tcv)
{
	uint8_t identifier;
	int ret = 0;

	if (!tcv_check_and_lock_ok(tcv))
		return TCV_ERR_INVALID_ARG;

	ret = tcv->read(tcv->index, TCV_DEVADDR_A0, TCV_IDENTIFIER, &identifier, 1);
	if (ret < 0) {
		tcv_unlock(tcv);
		return ret;
	}

	/* if someone calls init on a transceiver with alloc'ed data - clear it first */
	if (tcv->data) {
		free(tcv->data);
		tcv->data = NULL;
	}

	switch (identifier) {
		case TCV_TYPE_SFP:
			ret = sfp_init(tcv);
			break;

//		TODO
//		case TCV_TYPE_XFP:
//			((sfp_data_t*)tcv->data) = malloc(sizeof(xfp_data_t));
//			((xfp_data_t*)((sfp_data_t*)tcv->data))->type = TCV_TYPE_XFP;
//			break;

		default:
			return TCV_ERR_GENERIC;
	}
	if (tcv_unlock(tcv))
		return TCV_ERR_GENERIC;

	return ret;
}